

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t *pwVar1;
  file_header *pfVar2;
  undefined1 *puVar3;
  int64_t *piVar4;
  char cVar5;
  compressed_block_header cVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  size_t __size;
  rar5 *rar;
  uint8_t *puVar10;
  uint16_t uVar11;
  wchar_t wVar12;
  uint32_t uVar13;
  int iVar14;
  wchar_t wVar15;
  size_t sVar16;
  uint8_t *puVar17;
  compressed_block_header *p;
  void *__src;
  rar5 *prVar18;
  uint *puVar19;
  int64_t iVar20;
  byte bVar21;
  byte bVar22;
  ushort uVar23;
  uint32_t uVar24;
  long lVar25;
  long lVar26;
  rar5 *prVar27;
  uint8_t uVar28;
  char *pcVar29;
  uint uVar30;
  size_t min;
  long lVar31;
  rar5 *prVar32;
  ulong uVar33;
  ulong uVar34;
  decode_table *pdVar35;
  uint uVar36;
  wchar_t wVar37;
  rar5 *prVar38;
  ulong uVar39;
  size_t sVar40;
  bool bVar41;
  uint16_t num_1;
  uint16_t filter_type;
  uint16_t num;
  uint8_t bit_length [20];
  uint8_t table [430];
  ushort local_284;
  ushort uStack_282;
  archive_read *local_280;
  rar5 *local_278;
  uint8_t *local_270;
  ulong uStack_268;
  uint *local_260;
  rar5 *local_258;
  wchar_t local_24c;
  size_t local_248;
  wchar_t local_23c;
  ulong local_238;
  rar5 *local_230;
  decode_table *local_228;
  rar5 *local_220;
  uint local_218 [8];
  decode_table *local_1f8;
  decode_table *local_1f0;
  ulong local_1e8 [38];
  uint8_t local_b6 [64];
  uint8_t local_76 [16];
  uint8_t local_66 [54];
  
  local_230 = (rar5 *)a->format->data;
  if (size != (size_t *)0x0) {
    *size = 0;
  }
  if (((local_230->file).field_0x20 & 8) != 0) {
    archive_set_error(&a->archive,0x54,"Can\'t decompress an entry marked as a directory");
    return L'\xffffffe7';
  }
  if ((local_230->skip_mode == L'\0') &&
     ((local_230->file).unpacked_size < (local_230->cstate).last_write_ptr)) {
    archive_set_error(&a->archive,0x16,"Unpacker has written too many bytes");
    return L'\xffffffe2';
  }
  lVar25 = 0x4b68;
  do {
    cVar5 = *(char *)((long)&local_230->header_initialized + lVar25);
    if (cVar5 != '\0') {
      if (buff != (void **)0x0) {
        *buff = *(void **)((long)&local_230->skip_mode + lVar25);
      }
      if (size != (size_t *)0x0) {
        *size = *(size_t *)((long)&local_230->qlist_offset + lVar25);
      }
      if (offset != (int64_t *)0x0) {
        *offset = *(int64_t *)((long)&local_230->rr_offset + lVar25);
      }
      *(undefined1 *)((long)&local_230->header_initialized + lVar25) = 0;
      break;
    }
    lVar25 = lVar25 + 0x20;
  } while (lVar25 == 0x4b88);
  if (cVar5 != '\0') {
    return L'\0';
  }
  bVar21 = (local_230->file).field_0x20;
  if ((bVar21 & 4) != 0) {
    return L'\x01';
  }
  if ((bVar21 & 2) == 0) {
    wVar15 = (local_230->cstate).method;
    if ((uint)(wVar15 + L'\xffffffff') < 5) {
      local_280 = a;
      if (offset != (int64_t *)0x0) {
        *offset = (local_230->cstate).last_write_ptr;
      }
      do {
        prVar18 = (rar5 *)a->format->data;
        if ((undefined1  [19312])((undefined1  [19312])prVar18->cstate & (undefined1  [19312])0x1)
            == (undefined1  [19312])0x0) {
          if ((((ulong)prVar18->main & 1) == 0) || ((prVar18->cstate).window_buf == (uint8_t *)0x0))
          {
            (prVar18->file).calculated_crc32 = 0;
            lVar25 = (prVar18->cstate).window_size;
            sVar16 = lVar25 - 1;
            if (lVar25 == 0) {
              sVar16 = 0;
            }
            (prVar18->cstate).window_mask = sVar16;
            free((prVar18->cstate).window_buf);
            free((prVar18->cstate).filtered_buf);
            __size = (prVar18->cstate).window_size;
            if ((long)__size < 1) {
              (prVar18->cstate).window_buf = (uint8_t *)0x0;
              puVar17 = (uint8_t *)0x0;
            }
            else {
              puVar17 = (uint8_t *)calloc(1,__size);
              (prVar18->cstate).window_buf = puVar17;
              puVar17 = (uint8_t *)calloc(1,__size);
            }
            (prVar18->cstate).filtered_buf = puVar17;
            (prVar18->cstate).write_ptr = 0;
            (prVar18->cstate).last_write_ptr = 0;
            memset(&(prVar18->cstate).bd,0,0x4a9c);
          }
          *(byte *)&prVar18->cstate = *(byte *)&prVar18->cstate | 1;
        }
        if ((prVar18->cstate).window_size == 0) {
          archive_set_error(&a->archive,0x54,"Invalid window size declaration in this file");
LAB_00156068:
          wVar15 = L'\xffffffe2';
        }
        else {
          local_220 = prVar18;
          if ((undefined1  [19312])((undefined1  [19312])prVar18->cstate & (undefined1  [19312])0x2)
              != (undefined1  [19312])0x0) {
            do {
              prVar18 = (rar5 *)a->format->data;
              if (((((ulong)prVar18->main & 2) == 0) || ((prVar18->file).bytes_remaining != 0)) ||
                 (wVar15 = advance_multivolume(a), wVar15 == L'\0')) {
                local_278 = prVar18;
                if ((undefined1  [19312])
                    ((undefined1  [19312])prVar18->cstate & (undefined1  [19312])0x8) ==
                    (undefined1  [19312])0x0) {
                  p = (compressed_block_header *)(prVar18->cstate).block_buf;
                }
                else {
                  local_1e8[0] = 0xffffffffffffffff;
                  p = (compressed_block_header *)__archive_read_ahead(a,6,(ssize_t *)local_1e8);
                  wVar12 = L'\x01';
                  wVar15 = wVar12;
                  if (p == (compressed_block_header *)0x0) {
LAB_00155808:
                    bVar41 = false;
                  }
                  else {
                    cVar6 = *p;
                    prVar18->last_block_hdr = cVar6;
                    uVar23 = (ushort)cVar6 >> 3 & 7;
                    bVar21 = (byte)uVar23;
                    if (bVar21 < 3) {
                      wVar15 = L'\xffffffe2';
                      if (bVar21 == 2) {
                        local_248 = (ulong)((uint)p[1].block_cksum << 8 |
                                           (uint)p[2].block_flags_u8 << 0x10) |
                                    (ulong)p[1].block_flags_u8;
                      }
                      else if (uVar23 == 1) {
                        local_248 = (size_t)(ushort)p[1];
                      }
                      else {
                        if (((ushort)cVar6 >> 3 & 7) != 0) {
                          local_248 = 0;
                          bVar41 = false;
                          goto LAB_0015514e;
                        }
                        local_248 = (size_t)p[1].block_flags_u8;
                      }
                      if ((((uint)(local_248 >> 0x10) ^ (uint)local_248 ^
                            (uint)(local_248 >> 8) ^ (uint)cVar6.block_flags_u8 ^ 0x5a) & 0xff) ==
                          (uint)(local_278->last_block_hdr).block_cksum) {
                        wVar15 = L'\0';
                        bVar41 = true;
                      }
                      else {
                        bVar41 = false;
                        archive_set_error(&local_280->archive,0x54,
                                          "Block checksum error: got 0x%x, expected 0x%x");
                      }
                    }
                    else {
                      bVar41 = false;
                      archive_set_error(&a->archive,0x54,
                                        "Unsupported block header size (was %d, max is 2)");
                      wVar15 = L'\xffffffe2';
                    }
LAB_0015514e:
                    prVar18 = local_278;
                    a = local_280;
                    if (bVar41) {
                      lVar25 = (ulong)((local_278->last_block_hdr).block_flags_u8 >> 3 & 7) + 3;
                      iVar20 = __archive_read_consume(local_280,lVar25);
                      wVar15 = wVar12;
                      if (iVar20 != lVar25) goto LAB_00155808;
                      lVar25 = (prVar18->file).bytes_remaining - lVar25;
                      (prVar18->file).bytes_remaining = lVar25;
                      if (lVar25 < (long)local_248) {
                        prVar27 = (rar5 *)a->format->data;
                        if (prVar27->merge_mode == L'\0') {
                          *(byte *)&prVar27->cstate = *(byte *)&prVar27->cstate | 4;
                          puVar17 = (prVar27->vol).push_buf;
                          local_258 = prVar27;
                          if (puVar17 != (uint8_t *)0x0) {
                            free(puVar17);
                          }
                          sVar16 = local_248;
                          puVar17 = (uint8_t *)malloc(local_248 + 8);
                          (local_258->vol).push_buf = puVar17;
                          if (puVar17 == (uint8_t *)0x0) {
                            iVar14 = 0xc;
                            pcVar29 = "Can\'t allocate memory for a merge block buffer.";
                            goto LAB_001551be;
                          }
                          puVar17 = puVar17 + sVar16;
                          puVar17[0] = '\0';
                          puVar17[1] = '\0';
                          puVar17[2] = '\0';
                          puVar17[3] = '\0';
                          puVar17[4] = '\0';
                          puVar17[5] = '\0';
                          puVar17[6] = '\0';
                          puVar17[7] = '\0';
                          min = (local_258->file).bytes_remaining;
                          if ((long)sVar16 <= (long)min) {
                            min = sVar16;
                          }
                          if (min != 0) {
                            puVar17 = (uint8_t *)0x0;
                            do {
                              local_1e8[0] = 0xffffffffffffffff;
                              __src = __archive_read_ahead(a,min,(ssize_t *)local_1e8);
                              prVar27 = local_258;
                              wVar12 = L'\x01';
                              prVar18 = local_278;
                              if (__src == (void *)0x0) goto LAB_00155380;
                              if ((long)local_248 < (long)(puVar17 + min)) {
                                iVar14 = 0x16;
                                pcVar29 = "Consumed too much data when merging blocks.";
                                a = local_280;
                                goto LAB_00155369;
                              }
                              local_270 = puVar17 + min;
                              memcpy(puVar17 + (long)(local_258->vol).push_buf,__src,min);
                              sVar16 = __archive_read_consume(local_280,min);
                              a = local_280;
                              prVar18 = local_278;
                              if (sVar16 != min) goto LAB_00155380;
                              sVar16 = (prVar27->file).bytes_remaining;
                              (prVar27->file).bytes_remaining = sVar16 - min;
                              sVar40 = local_248 - (long)local_270;
                              if (sVar40 == 0) {
                                p = (compressed_block_header *)(prVar27->vol).push_buf;
                                wVar12 = L'\0';
                                goto LAB_00155380;
                              }
                              if (sVar16 == min) {
                                prVar27->merge_mode = prVar27->merge_mode + L'\x01';
                                wVar12 = advance_multivolume(local_280);
                                local_258->merge_mode = local_258->merge_mode + L'\xffffffff';
                                prVar27 = local_258;
                                a = local_280;
                                prVar18 = local_278;
                                if (wVar12 != L'\0') goto LAB_00155380;
                              }
                              sVar16 = (prVar27->file).bytes_remaining;
                              min = sVar40;
                              if ((long)sVar16 < (long)sVar40) {
                                min = sVar16;
                              }
                              a = local_280;
                              puVar17 = local_270;
                            } while (min != 0);
                          }
                          iVar14 = 0x54;
                          pcVar29 = "Encountered block size == 0 during block merge";
LAB_00155369:
                          archive_set_error(&a->archive,iVar14,pcVar29);
                          wVar12 = L'\xffffffe2';
                          prVar18 = local_278;
                        }
                        else {
                          iVar14 = 0x16;
                          pcVar29 = "Recursive merge is not allowed";
LAB_001551be:
                          archive_set_error(&a->archive,iVar14,pcVar29);
                          wVar12 = L'\xffffffe2';
                        }
LAB_00155380:
                        wVar15 = wVar12;
                        if (wVar12 != L'\0') goto LAB_00155808;
                      }
                      else {
                        *(byte *)&prVar18->cstate = *(byte *)&prVar18->cstate & 0xfb;
                        local_1e8[0] = 0xffffffffffffffff;
                        p = (compressed_block_header *)
                            __archive_read_ahead(a,local_248 + 4,(ssize_t *)local_1e8);
                        if (p == (compressed_block_header *)0x0) goto LAB_00155808;
                      }
                      (prVar18->cstate).block_buf = &p->block_flags_u8;
                      (prVar18->cstate).cur_block_size = local_248;
                      *(byte *)&prVar18->cstate = *(byte *)&prVar18->cstate & 0xf7;
                      (prVar18->bits).in_addr = L'\0';
                      (prVar18->bits).bit_addr = '\0';
                      wVar15 = wVar12;
                      if ((char)(prVar18->last_block_hdr).block_flags_u8 < '\0') {
                        iVar14 = 0;
                        bVar21 = 4;
                        wVar37 = L'\0';
                        wVar12 = L'ð';
                        do {
                          if ((long)local_248 <= (long)wVar37) {
                            archive_set_error(&a->archive,0x54,"Truncated data in huffman tables");
                            wVar15 = L'\xffffffe2';
                            goto LAB_001557fa;
                          }
                          uVar36 = (uint)((uint)(&p->block_flags_u8)[wVar37] & wVar12) >> bVar21;
                          wVar37 = wVar37 + (uint)(wVar12 == L'\x0f');
                          wVar15 = wVar12 ^ 0xff;
                          bVar22 = bVar21 ^ 4;
                          if (uVar36 == 0xf) {
                            uVar36 = wVar15 & (uint)(&p->block_flags_u8)[wVar37];
                            wVar37 = wVar37 + (uint)(wVar12 == L'ð');
                            wVar15 = wVar12;
                            if (uVar36 >> bVar22 == 0) {
                              lVar25 = (long)iVar14;
                              iVar14 = iVar14 + 1;
                              *(undefined1 *)((long)local_218 + lVar25) = 0xf;
                            }
                            else if (iVar14 < 0x14) {
                              local_270 = (uint8_t *)(long)iVar14;
                              uVar30 = (uVar36 >> bVar22) + 1;
                              uVar36 = 0x13U - iVar14;
                              if (uVar30 < 0x13U - iVar14) {
                                uVar36 = uVar30;
                              }
                              memset((uint8_t *)((long)local_218 + (long)local_270),0,
                                     (ulong)(uVar36 + 1));
                              uVar39 = 0x13U - (long)local_270;
                              if ((ulong)uVar30 <= 0x13U - (long)local_270) {
                                uVar39 = (ulong)uVar30;
                              }
                              iVar14 = iVar14 + (int)uVar39 + 1;
                            }
                          }
                          else {
                            lVar25 = (long)iVar14;
                            iVar14 = iVar14 + 1;
                            *(char *)((long)local_218 + lVar25) = (char)uVar36;
                            bVar21 = bVar22;
                          }
                          prVar18 = local_278;
                          a = local_280;
                          wVar12 = wVar15;
                        } while (iVar14 < 0x14);
                        (local_278->bits).in_addr = wVar37;
                        (local_278->bits).bit_addr = bVar21 ^ 4;
                        pdVar35 = &(local_278->cstate).bd;
                        create_decode_tables((uint8_t *)local_218,pdVar35,L'\x14');
                        uVar36 = 0;
                        do {
                          if (0x1ad < (int)uVar36) {
                            create_decode_tables((uint8_t *)local_1e8,&(prVar18->cstate).ld,L'Ĳ');
                            create_decode_tables(local_b6,&(prVar18->cstate).dd,L'@');
                            create_decode_tables(local_76,&(prVar18->cstate).ldd,L'\x10');
                            create_decode_tables(local_66,&(prVar18->cstate).rd,L',');
                            wVar15 = L'\0';
                            break;
                          }
                          wVar12 = decode_number(a,pdVar35,&p->block_flags_u8,(uint16_t *)&local_23c
                                                );
                          if (wVar12 != L'\0') {
                            bVar41 = false;
                            archive_set_error(&a->archive,0x54,"Decoding huffman tables failed");
                            wVar15 = L'\xffffffe2';
                            goto LAB_00155535;
                          }
                          uVar23 = (ushort)local_23c;
                          if ((ushort)local_23c < 0x10) {
                            *(char *)((long)local_1e8 + (long)(int)uVar36) = (char)local_23c;
                            uVar36 = uVar36 + 1;
LAB_00155533:
                            bVar41 = true;
                          }
                          else if ((ushort)local_23c < 0x12) {
                            wVar12 = read_bits_16(local_280,prVar18,&p->block_flags_u8,&uStack_282);
                            if (wVar12 == L'\0') {
                              uVar7 = uStack_282 >> 9;
                              uStack_282 = (uStack_282 >> 0xd) + 3;
                              if (uVar23 != 0x10) {
                                uStack_282 = uVar7 + 0xb;
                              }
                              iVar14 = (int)(prVar18->bits).bit_addr + (uint)(uVar23 != 0x10) * 4 +
                                       3;
                              pwVar1 = &(prVar18->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar14 >> 3);
                              (prVar18->bits).bit_addr = (byte)iVar14 & 7;
                              if ((int)uVar36 < 1) {
                                bVar41 = false;
                                archive_set_error(&local_280->archive,0x54,
                                                  "Unexpected error when decoding huffman tables");
                                wVar15 = L'\xffffffe2';
                              }
                              else {
                                bVar41 = uStack_282 != 0;
                                uStack_282 = uStack_282 - 1;
                                if (bVar41) {
                                  uVar39 = (ulong)uVar36;
                                  iVar14 = uVar36 - 1;
                                  lVar25 = 0;
                                  uVar30 = uVar36;
                                  do {
                                    *(undefined1 *)((long)local_1e8 + lVar25 + uVar39) =
                                         *(undefined1 *)
                                          ((long)local_1e8 + (ulong)(uint)(iVar14 + (int)lVar25));
                                    uVar23 = (ushort)lVar25;
                                    uVar36 = uVar30 + 1;
                                    lVar25 = lVar25 + 1;
                                    if (uStack_282 == uVar23) break;
                                    bVar41 = (int)uVar30 < 0x1ad;
                                    uVar30 = uVar36;
                                  } while (bVar41);
                                  uStack_282 = uStack_282 - (short)lVar25;
                                }
                                bVar41 = true;
                              }
                            }
                            else {
                              bVar41 = false;
                              wVar15 = wVar12;
                            }
                            if (bVar41) goto LAB_00155533;
                            bVar41 = false;
                          }
                          else {
                            wVar37 = read_bits_16(local_280,prVar18,&p->block_flags_u8,&uStack_282);
                            wVar12 = wVar37;
                            if (wVar37 == L'\0') {
                              uVar11 = (uStack_282 >> 0xd) + 3;
                              if (uVar23 != 0x12) {
                                uVar11 = (uStack_282 >> 9) + 0xb;
                              }
                              iVar14 = (int)(prVar18->bits).bit_addr + (uint)(uVar23 != 0x12) * 4 +
                                       3;
                              pwVar1 = &(prVar18->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar14 >> 3);
                              (prVar18->bits).bit_addr = (byte)iVar14 & 7;
                              uStack_282 = uVar11 - 1;
                              wVar12 = wVar15;
                              if (uVar11 != 0) {
                                local_270 = (uint8_t *)(long)(int)uVar36;
                                uVar30 = 0x1ad;
                                if (0x1ad < (int)uVar36) {
                                  uVar30 = uVar36;
                                }
                                local_258 = (rar5 *)(ulong)uStack_282;
                                prVar18 = (rar5 *)(ulong)(uVar30 - uVar36);
                                if (local_258 <= (rar5 *)(ulong)(uVar30 - uVar36)) {
                                  prVar18 = local_258;
                                }
                                uStack_282 = uVar11;
                                memset((uint8_t *)((long)local_1e8 + (long)local_270),0,
                                       (size_t)((long)&prVar18->header_initialized + 1));
                                puVar17 = (uint8_t *)0x1ad;
                                if (0x1ad < (long)local_270) {
                                  puVar17 = local_270;
                                }
                                prVar18 = (rar5 *)(puVar17 + -(long)local_270);
                                if (local_258 <= (rar5 *)(puVar17 + -(long)local_270)) {
                                  prVar18 = local_258;
                                }
                                uStack_282 = (uVar11 - (short)prVar18) - 2;
                                uVar36 = uVar36 + (int)prVar18 + 1;
                              }
                            }
                            wVar15 = wVar12;
                            prVar18 = local_278;
                            if (wVar37 == L'\0') goto LAB_00155533;
                            bVar41 = false;
                          }
LAB_00155535:
                          a = local_280;
                        } while (bVar41);
LAB_001557fa:
                        if (wVar15 != L'\0') goto LAB_00155808;
                      }
                      bVar41 = true;
                    }
                    else {
                      bVar41 = false;
                    }
                  }
                  if (!bVar41) goto LAB_00155f7a;
                }
                prVar18 = (rar5 *)a->format->data;
                if ((prVar18->cstate).write_ptr - (prVar18->cstate).last_write_ptr <=
                    (prVar18->cstate).window_size >> 1) {
                  local_258 = (rar5 *)(prVar18->cstate).window_mask;
                  local_270 = (uint8_t *)
                              (CONCAT71(local_270._1_7_,(prVar18->last_block_hdr).block_flags_u8) &
                              0xffffffffffffff07);
                  local_1f0 = &(prVar18->cstate).rd;
                  local_228 = &(prVar18->cstate).dd;
                  local_1f8 = &(prVar18->cstate).ldd;
                  do {
                    while( true ) {
                      lVar26 = (long)(prVar18->bits).in_addr;
                      lVar25 = (prVar18->cstate).cur_block_size;
                      if ((lVar25 <= lVar26) ||
                         ((lVar25 + -1 == lVar26 && ((char)local_270 < (prVar18->bits).bit_addr))))
                      {
                        *(byte *)&prVar18->cstate = *(byte *)&prVar18->cstate | 8;
                        goto LAB_00155f72;
                      }
                      wVar15 = decode_number(a,&(prVar18->cstate).ld,&p->block_flags_u8,&local_284);
                      if (wVar15 != L'\0') {
                        wVar15 = L'\x01';
                        goto LAB_00155f75;
                      }
                      if (0xff < local_284) break;
                      lVar25 = (prVar18->cstate).write_ptr;
                      (prVar18->cstate).write_ptr = lVar25 + 1;
                      (prVar18->cstate).window_buf
                      [lVar25 + (prVar18->cstate).solid_offset & (ulong)local_258] =
                           (uint8_t)local_284;
LAB_0015599d:
                      if ((prVar18->cstate).window_size >> 1 <
                          (prVar18->cstate).write_ptr - (prVar18->cstate).last_write_ptr)
                      goto LAB_00155f72;
                    }
                    uVar36 = (uint)local_284;
                    if (uVar36 < 0x106) {
                      if (local_284 == 0x101) {
                        wVar15 = (prVar18->cstate).last_len;
                        if ((wVar15 == L'\0') ||
                           (wVar15 = copy_string(a,wVar15,(prVar18->cstate).dist_cache[0]),
                           wVar15 == L'\0')) goto LAB_0015599d;
                        wVar15 = L'\xffffffe2';
                      }
                      else {
                        if (uVar36 != 0x100) {
                          wVar15 = (prVar18->cstate).dist_cache[uVar36 - 0x102];
                          uVar39 = (ulong)(uVar36 - 0x102);
                          if (0x102 < local_284) {
                            do {
                              (prVar18->cstate).dist_cache[uVar39] =
                                   (prVar18->cstate).dist_cache[uVar39 - 1];
                              bVar41 = 1 < (long)uVar39;
                              uVar39 = uVar39 - 1;
                            } while (bVar41);
                          }
                          (prVar18->cstate).dist_cache[0] = wVar15;
                          wVar12 = decode_number(a,local_1f0,&p->block_flags_u8,
                                                 (uint16_t *)local_1e8);
                          if (wVar12 == L'\0') {
                            wVar12 = decode_code_length(a,prVar18,&p->block_flags_u8,
                                                        (uint16_t)local_1e8[0]);
                            if (wVar12 != L'\xffffffff') {
                              (prVar18->cstate).last_len = wVar12;
                              wVar15 = copy_string(a,wVar12,wVar15);
                              bVar41 = wVar15 == L'\0';
                              wVar15 = local_24c;
                              if (!bVar41) {
                                wVar15 = L'\xffffffe2';
                              }
                              goto joined_r0x00155bc0;
                            }
                          }
                          bVar41 = false;
                          wVar15 = L'\xffffffe2';
                          goto joined_r0x00155bc0;
                        }
                        prVar27 = (rar5 *)a->format->data;
                        wVar15 = parse_filter_data(a,prVar27,&p->block_flags_u8,
                                                   (uint32_t *)local_1e8);
                        if (((wVar15 == L'\0') &&
                            (wVar15 = parse_filter_data(a,prVar27,&p->block_flags_u8,local_218),
                            wVar15 == L'\0')) &&
                           (wVar15 = read_bits_16(a,prVar27,&p->block_flags_u8,&uStack_282),
                           wVar15 == L'\0')) {
                          uVar23 = uStack_282 >> 0xd;
                          iVar14 = (prVar27->bits).bit_addr + 3;
                          pwVar1 = &(prVar27->bits).in_addr;
                          *pwVar1 = *pwVar1 + (iVar14 >> 3);
                          (prVar27->bits).bit_addr = (byte)iVar14 & 7;
                          if ((short)uStack_282 < 0 || local_218[0] - 0x400001 < 0xffc00003) {
LAB_00155a66:
                            iVar14 = 0x54;
                            pcVar29 = "Invalid filter encountered";
                            uStack_282 = uVar23;
                          }
                          else {
                            lVar25 = (prVar27->cstate).last_block_start;
                            lVar26 = (prVar27->cstate).last_block_length;
                            if ((lVar26 != 0 && lVar25 != 0) &&
                               ((long)((prVar27->cstate).write_ptr + (local_1e8[0] & 0xffffffff)) <
                                lVar26 + lVar25)) goto LAB_00155a66;
                            local_260 = (uint *)CONCAT44(local_260._4_4_,(uint)uStack_282);
                            uStack_282 = uVar23;
                            uStack_268 = (ulong)local_218[0];
                            local_238 = local_1e8[0] & 0xffffffff;
                            puVar19 = (uint *)calloc(1,0x28);
                            if (puVar19 == (uint *)0x0) {
                              puVar19 = (uint *)0x0;
                            }
                            else {
                              uVar7 = (prVar27->cstate).filters.size;
                              uVar8 = (prVar27->cstate).filters.cap_mask;
                              if (uVar8 + 1 != (uint)uVar7) {
                                uVar9 = (prVar27->cstate).filters.end_pos;
                                (prVar27->cstate).filters.arr[uVar9] = (size_t)puVar19;
                                (prVar27->cstate).filters.end_pos = uVar8 & uVar9 + 1;
                                (prVar27->cstate).filters.size = uVar7 + 1;
                              }
                            }
                            if (puVar19 != (uint *)0x0) {
                              *puVar19 = (uint)uVar23;
                              lVar25 = local_238 + (prVar27->cstate).write_ptr;
                              *(long *)(puVar19 + 4) = lVar25;
                              *(ulong *)(puVar19 + 6) = uStack_268;
                              (prVar27->cstate).last_block_start = lVar25;
                              (prVar27->cstate).last_block_length = uStack_268;
                              wVar15 = L'\0';
                              if (((uint)local_260 < 0x2000) &&
                                 (local_260 = puVar19,
                                 wVar15 = read_consume_bits(a,prVar27,&p->block_flags_u8,L'\x05',
                                                            &local_23c), wVar15 == L'\0')) {
                                local_260[1] = local_23c + L'\x01';
                                wVar15 = L'\0';
                              }
                              goto LAB_0015596c;
                            }
                            iVar14 = 0xc;
                            pcVar29 = "Can\'t allocate memory for a filter descriptor.";
                          }
                          archive_set_error(&a->archive,iVar14,pcVar29);
                          wVar15 = L'\xffffffe2';
                        }
LAB_0015596c:
                        if (wVar15 == L'\0') goto LAB_0015599d;
                      }
                      goto LAB_00155f75;
                    }
                    wVar15 = decode_code_length(a,prVar18,&p->block_flags_u8,local_284 - 0x106);
                    if (wVar15 == L'\xffffffff') {
                      pcVar29 = "Failed to decode the code length";
LAB_00155bac:
                      bVar41 = false;
                      archive_set_error(&a->archive,0x16,pcVar29);
                      a = local_280;
                      wVar15 = L'\xffffffe2';
                    }
                    else {
                      puVar19 = (uint *)(ulong)(uint)wVar15;
                      wVar15 = decode_number(a,local_228,&p->block_flags_u8,(uint16_t *)local_218);
                      if (wVar15 != L'\0') {
                        pcVar29 = "Failed to decode the distance slot";
                        goto LAB_00155bac;
                      }
                      uVar36 = local_218[0] & 0xffff;
                      wVar12 = L'\0';
                      if (3 < (ushort)local_218[0]) {
                        wVar12 = (uint)((ushort)local_218[0] >> 1) + L'\xffffffff';
                        uVar36 = (local_218[0] & 1 | 2) << ((byte)wVar12 & 0x1f);
                      }
                      wVar37 = uVar36 + L'\x01';
                      local_260 = puVar19;
                      wVar15 = local_24c;
                      if (L'\0' < wVar12) {
                        if (wVar12 < L'\x04') {
                          uStack_268 = CONCAT44(uStack_268._4_4_,wVar37);
                          wVar12 = read_consume_bits(a,prVar18,&p->block_flags_u8,wVar12,
                                                     (wchar_t *)local_1e8);
                          bVar41 = false;
                          wVar37 = L'\0';
                          if (wVar12 == L'\0') {
                            wVar37 = (wchar_t)local_1e8[0];
                          }
                          wVar15 = local_24c;
                          if (wVar12 != L'\0') {
                            wVar15 = wVar12;
                          }
                          a = local_280;
                          if (wVar12 != L'\0') goto joined_r0x00155bc0;
                          wVar37 = (wchar_t)uStack_268 + wVar37;
                        }
                        else {
                          if (wVar12 == L'\x04') {
                            uStack_268 = CONCAT44(uStack_268._4_4_,wVar37);
LAB_00155e35:
                            wVar15 = decode_number(a,local_1f8,&p->block_flags_u8,
                                                   (uint16_t *)local_1e8);
                            if (wVar15 == L'\0') {
                              if ((wchar_t)uStack_268 <
                                  (int)(0x7ffffffe - (uint)(uint16_t)local_1e8[0])) {
                                bVar41 = true;
                                wVar37 = (wchar_t)uStack_268 + (uint)(uint16_t)local_1e8[0];
                                wVar15 = local_24c;
                              }
                              else {
                                bVar41 = false;
                                archive_set_error(&local_280->archive,0x54,
                                                  "Distance pointer overflow");
                                wVar15 = L'\xffffffe2';
                                wVar37 = (wchar_t)uStack_268;
                              }
                            }
                            else {
                              bVar41 = false;
                              archive_set_error(&a->archive,0x16,
                                                "Failed to decode the distance slot");
                              wVar37 = (wchar_t)uStack_268;
                              wVar15 = L'\xffffffe2';
                            }
                          }
                          else {
                            uVar33 = (ulong)(prVar18->bits).in_addr;
                            uVar39 = (prVar18->cstate).cur_block_size;
                            if ((long)uVar33 < (long)uVar39) {
                              uVar36 = *(uint *)(&p->block_flags_u8 + uVar33);
                              bVar21 = (prVar18->bits).bit_addr;
                              uVar36 = (uint)((&p[2].block_flags_u8)[uVar33] >> (8 - bVar21 & 0x1f))
                                       | (uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 |
                                          (uVar36 & 0xff00) << 8 | uVar36 << 0x18) <<
                                         (bVar21 & 0x1f);
                              wVar15 = L'\0';
                            }
                            else {
                              uVar36 = 0;
                              uStack_268 = uVar33;
                              local_238 = uVar39;
                              archive_set_error(&local_280->archive,0x16,
                                                "Premature end of stream during extraction of data (#1)"
                                               );
                              wVar15 = L'\xffffffe2';
                              uVar33 = uStack_268;
                              uVar39 = local_238;
                            }
                            if ((long)uVar33 < (long)uVar39) {
                              iVar14 = (prVar18->bits).bit_addr + wVar12 + -4;
                              pwVar1 = &(prVar18->bits).in_addr;
                              *pwVar1 = *pwVar1 + (iVar14 >> 3);
                              (prVar18->bits).bit_addr = (byte)iVar14 & 7;
                              uStack_268 = CONCAT44(uStack_268._4_4_,
                                                    wVar37 + (uVar36 >>
                                                             (0x24U - (char)wVar12 & 0x1f)) * 0x10);
                              a = local_280;
                              goto LAB_00155e35;
                            }
                            bVar41 = false;
                          }
                          a = local_280;
                          if (!bVar41) {
                            bVar41 = false;
                            goto joined_r0x00155bc0;
                          }
                        }
                      }
                      if (L'Ā' < wVar37) {
                        if (wVar37 < L'\x2001') {
                          local_260 = (uint *)(ulong)((int)local_260 + 1);
                        }
                        else {
                          local_260 = (uint *)(ulong)((int)local_260 +
                                                      (uint)(L'\x00040000' < wVar37) + 2);
                        }
                      }
                      (prVar18->cstate).dist_cache[3] = (prVar18->cstate).dist_cache[2];
                      *(undefined8 *)((prVar18->cstate).dist_cache + 1) =
                           *(undefined8 *)(prVar18->cstate).dist_cache;
                      (prVar18->cstate).dist_cache[0] = wVar37;
                      (prVar18->cstate).last_len = (wchar_t)local_260;
                      wVar12 = copy_string(a,(wchar_t)local_260,wVar37);
                      bVar41 = wVar12 == L'\0';
                      a = local_280;
                      if (!bVar41) {
                        wVar15 = L'\xffffffe2';
                      }
                    }
joined_r0x00155bc0:
                    if (!bVar41) goto LAB_00155f75;
                    local_24c = wVar15;
                  } while ((prVar18->cstate).write_ptr - (prVar18->cstate).last_write_ptr <=
                           (prVar18->cstate).window_size >> 1);
                }
LAB_00155f72:
                wVar15 = L'\0';
LAB_00155f75:
                prVar18 = local_278;
                if (wVar15 == L'\0') {
                  bVar21 = *(byte *)&local_278->cstate;
                  if (((bVar21 & 0xc) == 8) &&
                     (lVar25 = (local_278->cstate).cur_block_size, 0 < lVar25)) {
                    iVar20 = __archive_read_consume(a,lVar25);
                    wVar15 = L'\xffffffe2';
                    if (iVar20 == lVar25) {
                      pfVar2 = &prVar18->file;
                      pfVar2->bytes_remaining =
                           pfVar2->bytes_remaining - (prVar18->cstate).cur_block_size;
                      wVar15 = L'\0';
                    }
                  }
                  else {
                    wVar15 = L'\0';
                    if ((bVar21 & 4) != 0) {
                      *(byte *)&local_278->cstate = bVar21 & 0xfb;
                    }
                  }
                }
              }
LAB_00155f7a:
              if ((wVar15 == L'\xffffffe2') || (wVar15 == L'\x01')) goto LAB_00156168;
            } while ((local_220->cstate).last_write_ptr == (local_220->cstate).write_ptr);
          }
          prVar27 = local_220;
          prVar18 = (rar5 *)a->format->data;
          bVar21 = *(byte *)&prVar18->cstate;
          *(byte *)&prVar18->cstate = bVar21 & 0xfd;
          if ((prVar18->cstate).filters.size == 0) {
LAB_00154fa3:
            *(byte *)&prVar18->cstate = bVar21 | 2;
            iVar14 = 0;
          }
          else {
            puVar19 = (uint *)(prVar18->cstate).filters.arr[(prVar18->cstate).filters.beg_pos];
            lVar25 = (prVar18->cstate).write_ptr;
            lVar26 = *(long *)(puVar19 + 4);
            if ((lVar25 <= lVar26) || (lVar25 < *(long *)(puVar19 + 6) + lVar26)) goto LAB_00154fa3;
            lVar25 = (prVar18->cstate).last_write_ptr;
            if (lVar25 == lVar26) {
              rar = (rar5 *)a->format->data;
              free((rar->cstate).filtered_buf);
              local_258 = *(rar5 **)(puVar19 + 6);
              puVar17 = (uint8_t *)malloc((size_t)local_258);
              prVar38 = local_258;
              (rar->cstate).filtered_buf = puVar17;
              if (puVar17 == (uint8_t *)0x0) {
                archive_set_error(&a->archive,0xc,"Can\'t allocate memory for filter data.");
LAB_0015637b:
                bVar41 = false;
                iVar14 = -0x1e;
              }
              else {
                uVar36 = *puVar19;
                if (uVar36 - 1 < 2) {
                  pdVar35 = (decode_table *)(rar->cstate).window_buf;
                  uVar39 = (rar->cstate).window_mask;
                  uVar33 = *(long *)(puVar19 + 4) + (rar->cstate).solid_offset;
                  prVar32 = (rar5 *)(uVar33 & uVar39);
                  prVar27 = (rar5 *)((ulong)((long)&local_258->header_initialized + uVar33) & uVar39
                                    );
                  local_270 = (uint8_t *)(ulong)uVar36;
                  if (prVar27 < prVar32) {
                    local_278 = prVar27;
                    local_228 = pdVar35;
                    memcpy(puVar17,(void *)((long)pdVar35->decode_len +
                                           (long)&prVar32[-1].field_0x532c),
                           (uVar39 - (long)prVar32) + 1);
                    puVar17 = puVar17 + (uVar39 - (long)prVar32) + 1;
                    prVar27 = local_278;
                    pdVar35 = local_228;
                  }
                  else {
                    pdVar35 = (decode_table *)
                              ((long)((decode_table *)(pdVar35->decode_len + -1))->decode_len +
                              (long)&prVar32[-1].field_0x532c);
                    prVar27 = local_258;
                  }
                  memcpy(puVar17,pdVar35,(size_t)prVar27);
                  a = local_280;
                  if (4 < (long)prVar38) {
                    puVar17 = local_270;
                    uVar39 = 0;
                    do {
                      lVar25 = (rar->cstate).solid_offset + *(long *)(puVar19 + 4);
                      uVar33 = uVar39 + 1;
                      uVar34 = (rar->cstate).window_mask;
                      uVar28 = (rar->cstate).window_buf[lVar25 + uVar39 & uVar34];
                      if ((uVar28 == 0xe8) || ((int)puVar17 == 2 && uVar28 == 0xe9)) {
                        lVar26 = *(long *)(puVar19 + 4) + uVar33;
                        uVar36 = (uint)lVar26;
                        uVar30 = uVar36 + 0xffffff;
                        if (-1 < lVar26) {
                          uVar30 = uVar36;
                        }
                        iVar14 = uVar36 - (uVar30 & 0xff000000);
                        uVar13 = read_filter_data(rar,(uint)uVar34 & (int)lVar25 + (int)uVar33);
                        if ((int)uVar13 < 0) {
                          if (-1 < (int)(iVar14 + uVar13)) {
                            uVar24 = uVar13 + 0x1000000;
                            goto LAB_00156325;
                          }
                        }
                        else if ((int)uVar13 < 0x1000000) {
                          uVar13 = uVar13 - iVar14;
                          uVar24 = uVar13;
LAB_00156325:
                          puVar17 = (rar->cstate).filtered_buf;
                          uVar33 = uVar33 & 0xffffffff;
                          puVar17[uVar33] = (uint8_t)uVar13;
                          puVar17[uVar33 + 1] = (uint8_t)(uVar13 >> 8);
                          puVar17[uVar33 + 2] = (uint8_t)(uVar13 >> 0x10);
                          puVar17[uVar33 + 3] = (uint8_t)(uVar24 >> 0x18);
                        }
                        uVar33 = uVar39 + 5;
                        puVar17 = local_270;
                      }
                      a = local_280;
                      uVar39 = uVar33;
                    } while ((long)uVar33 < *(long *)(puVar19 + 6) + -4);
                  }
                }
                else if (uVar36 == 3) {
                  puVar10 = (rar->cstate).window_buf;
                  uVar39 = (rar->cstate).window_mask;
                  uVar33 = *(long *)(puVar19 + 4) + (rar->cstate).solid_offset;
                  uVar34 = uVar33 & uVar39;
                  uVar33 = (ulong)((long)&local_258->header_initialized + uVar33) & uVar39;
                  if (uVar33 < uVar34) {
                    local_270 = puVar10;
                    memcpy(puVar17,puVar10 + uVar34,(uVar39 - uVar34) + 1);
                    memcpy(puVar17 + (uVar39 - uVar34) + 1,local_270,uVar33);
                    prVar38 = local_258;
                  }
                  else {
                    memcpy(puVar17,puVar10 + uVar34,(size_t)local_258);
                  }
                  a = local_280;
                  if (3 < (long)prVar38) {
                    uVar39 = 0;
                    do {
                      lVar25 = (rar->cstate).solid_offset + *(long *)(puVar19 + 4);
                      uVar33 = (rar->cstate).window_mask;
                      if ((rar->cstate).window_buf[lVar25 + uVar39 + 3 & uVar33] == 0xeb) {
                        uVar13 = read_filter_data(rar,(int)lVar25 + (int)uVar39 & (uint)uVar33);
                        uVar34 = uVar39 + *(long *)(puVar19 + 4);
                        uVar33 = uVar39 + 3 + *(long *)(puVar19 + 4);
                        if (-1 < (long)uVar34) {
                          uVar33 = uVar34;
                        }
                        iVar14 = uVar13 - (int)(uVar33 >> 2);
                        puVar17 = (rar->cstate).filtered_buf;
                        uVar33 = uVar39 & 0xffffffff;
                        puVar17[uVar33] = (uint8_t)iVar14;
                        puVar17[uVar33 + 1] = (uint8_t)((uint)iVar14 >> 8);
                        puVar17[uVar33 + 2] = (uint8_t)((uint)iVar14 >> 0x10);
                        puVar17[uVar33 + 3] = 0xeb;
                      }
                      uVar39 = uVar39 + 4;
                    } while ((long)uVar39 < *(long *)(puVar19 + 6) + -3);
                  }
                }
                else {
                  if (uVar36 != 0) {
                    archive_set_error(&a->archive,0x54,"Unsupported filter type: 0x%x");
                    goto LAB_0015637b;
                  }
                  if (0 < (int)puVar19[1]) {
                    lVar25 = 0;
                    lVar26 = 0;
                    do {
                      if (lVar25 < *(long *)(puVar19 + 6)) {
                        uVar28 = '\0';
                        lVar31 = lVar25;
                        do {
                          uVar28 = uVar28 - (rar->cstate).window_buf
                                            [(rar->cstate).solid_offset + *(long *)(puVar19 + 4) +
                                             lVar26 & (rar->cstate).window_mask];
                          (rar->cstate).filtered_buf[lVar31] = uVar28;
                          lVar26 = lVar26 + 1;
                          lVar31 = lVar31 + (int)puVar19[1];
                        } while (lVar31 < *(long *)(puVar19 + 6));
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar25 < (int)puVar19[1]);
                  }
                }
                wVar15 = push_data_ready(a,rar,(rar->cstate).filtered_buf,*(size_t *)(puVar19 + 6),
                                         (rar->cstate).last_write_ptr);
                bVar41 = wVar15 == L'\0';
                if (bVar41) {
                  piVar4 = &(rar->cstate).last_write_ptr;
                  *piVar4 = *piVar4 + *(long *)(puVar19 + 6);
                  iVar14 = 0;
                  prVar27 = local_220;
                }
                else {
                  archive_set_error(&a->archive,0x16,"Stack overflow when submitting unpacked data")
                  ;
                  iVar14 = -0x1e;
                  prVar27 = local_220;
                }
              }
              a = local_280;
              if (bVar41) {
                uVar11 = (prVar18->cstate).filters.size;
                if (uVar11 != 0) {
                  uVar23 = (prVar18->cstate).filters.beg_pos;
                  puVar19 = (uint *)(prVar18->cstate).filters.arr[uVar23];
                  (prVar18->cstate).filters.beg_pos =
                       uVar23 + 1 & (prVar18->cstate).filters.cap_mask;
                  (prVar18->cstate).filters.size = uVar11 - 1;
                }
                free(puVar19);
                goto LAB_001564c2;
              }
            }
            else {
              push_window_data(a,prVar18,lVar25,lVar26);
LAB_001564c2:
              iVar14 = -10;
            }
          }
          wVar15 = L'\0';
          if (iVar14 != -10) {
            if (iVar14 == -0x1e) goto LAB_00156068;
            if ((prVar27->cstate).filters.size == 0) {
              lVar25 = (prVar27->cstate).write_ptr;
            }
            else {
              lVar26 = *(long *)((prVar27->cstate).filters.arr[(prVar27->cstate).filters.beg_pos] +
                                0x10);
              lVar25 = (prVar27->cstate).write_ptr;
              if (lVar26 < lVar25) {
                lVar25 = lVar26;
              }
            }
            lVar26 = (prVar27->cstate).last_write_ptr;
            if (lVar25 == lVar26) {
              wVar15 = L'\xfffffff6';
            }
            else {
              push_window_data(a,prVar27,lVar26,lVar25);
              (prVar27->cstate).last_write_ptr = lVar25;
            }
          }
        }
LAB_00156168:
      } while (wVar15 == L'\xfffffff6');
      goto LAB_001564df;
    }
    if (wVar15 != L'\0') {
      archive_set_error(&a->archive,0x54,"Compression method not supported: 0x%x");
      wVar15 = L'\xffffffe2';
      goto LAB_001564df;
    }
  }
  wVar15 = do_unstore_file(a,local_230,buff,size,offset);
LAB_001564df:
  if (wVar15 != L'\0') {
    return wVar15;
  }
  if ((local_230->file).bytes_remaining != 0) {
    return L'\0';
  }
  if ((local_230->cstate).last_write_ptr == (local_230->file).unpacked_size) {
    puVar3 = &(local_230->file).field_0x20;
    *puVar3 = *puVar3 | 4;
    wVar15 = verify_global_checksums(a);
    return wVar15;
  }
  return L'\0';
}

Assistant:

static int rar5_read_data(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset) {
	int ret;
	struct rar5* rar = get_context(a);

	if (size)
		*size = 0;

	if(rar->file.dir > 0) {
		/* Don't process any data if this file entry was declared
		 * as a directory. This is needed, because entries marked as
		 * directory doesn't have any dictionary buffer allocated, so
		 * it's impossible to perform any decompression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't decompress an entry marked as a directory");
		return ARCHIVE_FAILED;
	}

	if(!rar->skip_mode && (rar->cstate.last_write_ptr > rar->file.unpacked_size)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Unpacker has written too many bytes");
		return ARCHIVE_FATAL;
	}

	ret = use_data(rar, buff, size, offset);
	if(ret == ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.eof == 1) {
		return ARCHIVE_EOF;
	}

	ret = do_unpack(a, rar, buff, size, offset);
	if(ret != ARCHIVE_OK) {
		return ret;
	}

	if(rar->file.bytes_remaining == 0 &&
			rar->cstate.last_write_ptr == rar->file.unpacked_size)
	{
		/* If all bytes of current file were processed, run
		 * finalization.
		 *
		 * Finalization will check checksum against proper values. If
		 * some of the checksums will not match, we'll return an error
		 * value in the last `archive_read_data` call to signal an error
		 * to the user. */

		rar->file.eof = 1;
		return verify_global_checksums(a);
	}

	return ARCHIVE_OK;
}